

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

QRgbaFloat32 *
qt_fetch_linear_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  int v;
  QRgbaFloat32 *pQVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Type TVar9;
  
  dVar8 = (op->field_16).linear.l;
  dVar6 = 0.0;
  dVar4 = 0.0;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    dVar7 = (double)y + 0.5;
    dVar4 = (double)x + 0.5;
    dVar6 = data->dx + dVar7 * data->m21 + dVar4 * data->m11;
    dVar5 = data->dy + dVar7 * data->m22 + dVar4 * data->m12;
    dVar8 = data->m13;
    if ((dVar8 != 0.0) || (((NAN(dVar8) || (data->m23 != 0.0)) || (NAN(data->m23))))) {
      if (length < 1) {
        return buffer;
      }
      dVar8 = dVar7 * data->m23 + dVar4 * dVar8 + data->m33;
      pQVar1 = buffer;
      do {
        TVar9 = GradientBaseFP::fetchSingle
                          (&(data->field_23).gradient,
                           (dVar6 / dVar8) * (op->field_16).linear.dx +
                           (dVar5 / dVar8) * (op->field_16).linear.dy + (op->field_16).linear.off);
        pQVar1->r = TVar9.r;
        pQVar1->g = TVar9.g;
        pQVar1->b = TVar9.b;
        pQVar1->a = TVar9.a;
        dVar6 = dVar6 + data->m11;
        dVar5 = dVar5 + data->m12;
        dVar8 = dVar8 + data->m13;
        dVar8 = (double)((ulong)dVar8 & -(ulong)(dVar8 != 0.0) |
                        ~-(ulong)(dVar8 != 0.0) & (ulong)(data->m13 + dVar8));
        pQVar1 = pQVar1 + 1;
      } while (pQVar1 < buffer + length);
      return buffer;
    }
    dVar8 = (op->field_16).linear.dx;
    dVar7 = (op->field_16).linear.dy;
    dVar4 = (dVar5 * dVar7 + dVar8 * dVar6 + (op->field_16).linear.off) * 1023.0;
    dVar6 = (data->m12 * dVar7 + dVar8 * data->m11) * 1023.0;
  }
  if (1e-05 <= ABS(dVar6)) {
    if (((4194303.0 <= ABS(dVar6)) || (4194303.0 <= ABS(dVar4))) ||
       (4194303.0 <= ABS((double)length * dVar6 + dVar4))) {
      if (0 < length) {
        pQVar1 = buffer;
        do {
          TVar9 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar4 * 0.0009765625);
          pQVar1->r = TVar9.r;
          pQVar1->g = TVar9.g;
          pQVar1->b = TVar9.b;
          pQVar1->a = TVar9.a;
          dVar4 = dVar4 + dVar6;
          pQVar1 = pQVar1 + 1;
        } while (pQVar1 < buffer + length);
      }
    }
    else if (0 < length) {
      v = (int)(dVar4 * 256.0);
      pQVar1 = buffer;
      do {
        TVar9 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,v);
        pQVar1->r = TVar9.r;
        pQVar1->g = TVar9.g;
        pQVar1->b = TVar9.b;
        pQVar1->a = TVar9.a;
        v = v + (int)(dVar6 * 256.0);
        pQVar1 = pQVar1 + 1;
      } while (pQVar1 < buffer + length);
    }
  }
  else {
    if (4194303.0 <= ABS(dVar4)) {
      TVar9 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar4 * 0.0009765625);
      fVar2 = TVar9.r;
      fVar3 = TVar9.g;
    }
    else {
      TVar9 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,(int)(dVar4 * 256.0));
      fVar2 = TVar9.r;
      fVar3 = TVar9.g;
    }
    (*qt_memfill64)((quint64 *)buffer,CONCAT44(fVar3,fVar2),(long)length);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_linear_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_linear_gradient_template<GradientBaseFP, QRgbaFloat32>(buffer, op, data, y, x, length);
}